

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O0

void __thiscall
GslSpan_FromStdArrayConstructor_Test::TestBody(GslSpan_FromStdArrayConstructor_Test *this)

{
  pointer *ppeVar1;
  bool bVar2;
  char *pcVar3;
  AssertHelper local_278;
  Message local_270;
  pointer local_268;
  pointer local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_9;
  Message local_240;
  size_type local_238;
  index_type local_230;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_8;
  span<int,_4L> s_2;
  span<int_const,4l> local_200 [8];
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_1f8;
  anon_class_1_0_00000001 local_1e2;
  anon_class_1_0_00000001 local_1e1;
  anon_class_1_0_00000001 take_a_span;
  anon_class_1_0_00000001 get_an_array;
  Message local_1d8;
  pointer local_1d0;
  pointer local_1c8;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_7;
  Message local_1a8;
  size_type local_1a0;
  index_type local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_6;
  span<const_int,_4L> cs_1;
  Message local_170;
  pointer local_168;
  pointer local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_5;
  Message local_140;
  size_type local_138;
  index_type local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_4;
  span<int,_4L> s_1;
  Message local_108;
  pointer local_100;
  pointer local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_3;
  Message local_d8;
  size_type local_d0;
  index_type local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  span<int,_4L> cs;
  Message local_a0;
  pointer local_98;
  pointer local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70 [3];
  size_type local_58;
  index_type local_50;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  span<int,__1L> s;
  array<int,_4UL> arr;
  GslSpan_FromStdArrayConstructor_Test *this_local;
  
  s.storage_.data_ = (pointer)0x200000001;
  ppeVar1 = &s.storage_.data_;
  pstore::gsl::span<int,-1l>::span<4ul,int>
            ((span<int,_1l> *)&gtest_ar.message_,(array<int,_4UL> *)ppeVar1);
  local_50 = pstore::gsl::span<int,_-1L>::size((span<int,__1L> *)&gtest_ar.message_);
  local_58 = std::array<int,_4UL>::size((array<int,_4UL> *)ppeVar1);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_48,"s.size ()","static_cast<std::ptrdiff_t> (arr.size ())",&local_50,
             (long *)&local_58);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar2) {
    testing::Message::Message(local_70);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x17f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  local_90 = pstore::gsl::span<int,_-1L>::data((span<int,__1L> *)&gtest_ar.message_);
  local_98 = std::array<int,_4UL>::data((array<int,_4UL> *)&s.storage_.data_);
  testing::internal::EqHelper::Compare<int_*,_int_*,_nullptr>
            ((EqHelper *)local_88,"s.data ()","arr.data ()",&local_90,&local_98);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar2) {
    testing::Message::Message(&local_a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cs,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x180,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cs,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cs);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  ppeVar1 = &s.storage_.data_;
  pstore::gsl::span<int,4l>::span<4ul,int>
            ((span<int,4l> *)&gtest_ar_2.message_,(array<int,_4UL> *)ppeVar1);
  local_c8 = pstore::gsl::span<int,_4L>::size((span<int,_4L> *)&gtest_ar_2.message_);
  local_d0 = std::array<int,_4UL>::size((array<int,_4UL> *)ppeVar1);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_c0,"cs.size ()","static_cast<std::ptrdiff_t> (arr.size ())",&local_c8
             ,(long *)&local_d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar2) {
    testing::Message::Message(&local_d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x183,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_f8 = pstore::gsl::span<int,_4L>::data((span<int,_4L> *)&gtest_ar_2.message_);
  local_100 = std::array<int,_4UL>::data((array<int,_4UL> *)&s.storage_.data_);
  testing::internal::EqHelper::Compare<int_*,_int_*,_nullptr>
            ((EqHelper *)local_f0,"cs.data ()","arr.data ()",&local_f8,&local_100);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar2) {
    testing::Message::Message(&local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&s_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x184,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&s_1,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s_1);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  ppeVar1 = &s.storage_.data_;
  pstore::gsl::span<int,4l>::span<4ul,int>
            ((span<int,4l> *)&gtest_ar_4.message_,(array<int,_4UL> *)ppeVar1);
  local_130 = pstore::gsl::span<int,_4L>::size((span<int,_4L> *)&gtest_ar_4.message_);
  local_138 = std::array<int,_4UL>::size((array<int,_4UL> *)ppeVar1);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_128,"s.size ()","static_cast<std::ptrdiff_t> (arr.size ())",
             &local_130,(long *)&local_138);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar2) {
    testing::Message::Message(&local_140);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x188,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  local_160 = pstore::gsl::span<int,_4L>::data((span<int,_4L> *)&gtest_ar_4.message_);
  local_168 = std::array<int,_4UL>::data((array<int,_4UL> *)&s.storage_.data_);
  testing::internal::EqHelper::Compare<int_*,_int_*,_nullptr>
            ((EqHelper *)local_158,"s.data ()","arr.data ()",&local_160,&local_168);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar2) {
    testing::Message::Message(&local_170);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cs_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x189,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cs_1,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cs_1);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  ppeVar1 = &s.storage_.data_;
  pstore::gsl::span<int_const,4l>::span<4ul,int>
            ((span<int_const,4l> *)&gtest_ar_6.message_,(array<int,_4UL> *)ppeVar1);
  local_198 = pstore::gsl::span<const_int,_4L>::size((span<const_int,_4L> *)&gtest_ar_6.message_);
  local_1a0 = std::array<int,_4UL>::size((array<int,_4UL> *)ppeVar1);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_190,"cs.size ()","static_cast<std::ptrdiff_t> (arr.size ())",
             &local_198,(long *)&local_1a0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar2) {
    testing::Message::Message(&local_1a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x18c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  local_1c8 = pstore::gsl::span<const_int,_4L>::data((span<const_int,_4L> *)&gtest_ar_6.message_);
  local_1d0 = std::array<int,_4UL>::data((array<int,_4UL> *)&s.storage_.data_);
  testing::internal::EqHelper::Compare<const_int_*,_int_*,_nullptr>
            ((EqHelper *)local_1c0,"cs.data ()","arr.data ()",&local_1c8,&local_1d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar2) {
    testing::Message::Message(&local_1d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x18d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffe20,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe20);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  _s_2 = TestBody::anon_class_1_0_00000001::operator()(&local_1e1);
  pstore::gsl::span<int_const,4l>::span<4ul,int>(local_200,(array<int,_4UL> *)&s_2);
  pstore::gsl::span<int_const,-1l>::span<int_const,4l>
            ((span<int_const,_1l> *)&local_1f8,(span<const_int,_4L> *)local_200);
  TestBody::anon_class_1_0_00000001::operator()(&local_1e2,(span<const_int,__1L>)local_1f8);
  ppeVar1 = &s.storage_.data_;
  gtest_ar_8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::gsl::make_span<int,4ul>((array<int,_4UL> *)ppeVar1);
  local_230 = pstore::gsl::span<int,_4L>::size((span<int,_4L> *)&gtest_ar_8.message_);
  local_238 = std::array<int,_4UL>::size((array<int,_4UL> *)ppeVar1);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_228,"s.size ()","static_cast<std::ptrdiff_t> (arr.size ())",
             &local_230,(long *)&local_238);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar2) {
    testing::Message::Message(&local_240);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x1b0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  local_260 = pstore::gsl::span<int,_4L>::data((span<int,_4L> *)&gtest_ar_8.message_);
  local_268 = std::array<int,_4UL>::data((array<int,_4UL> *)&s.storage_.data_);
  testing::internal::EqHelper::Compare<int_*,_int_*,_nullptr>
            ((EqHelper *)local_258,"s.data ()","arr.data ()",&local_260,&local_268);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar2) {
    testing::Message::Message(&local_270);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x1b1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  return;
}

Assistant:

TEST (GslSpan, FromStdArrayConstructor) {
    std::array<int, 4> arr = {{1, 2, 3, 4}};

    {
        span<int> s{arr};
        EXPECT_EQ (s.size (), static_cast<std::ptrdiff_t> (arr.size ()));
        EXPECT_EQ (s.data (), arr.data ());

        span<int, 4> cs{arr};
        EXPECT_EQ (cs.size (), static_cast<std::ptrdiff_t> (arr.size ()));
        EXPECT_EQ (cs.data (), arr.data ());
    }
    {
        span<int, 4> s{arr};
        EXPECT_EQ (s.size (), static_cast<std::ptrdiff_t> (arr.size ()));
        EXPECT_EQ (s.data (), arr.data ());

        span<int const, 4> cs{arr};
        EXPECT_EQ (cs.size (), static_cast<std::ptrdiff_t> (arr.size ()));
        EXPECT_EQ (cs.data (), arr.data ());
    }

#ifdef CONFIRM_COMPILATION_ERRORS
    {
        span<int, 2> s{arr};
        EXPECT_EQ (s.size () == 2 && s.data (), arr.data ());

        span<const int, 2> cs{arr};
        EXPECT_EQ (cs.size () == 2 && cs.data (), arr.data ());
    }
    {
        span<int, 0> s{arr};
        EXPECT_EQ (s.size () == 0 && s.data (), arr.data ());

        span<const int, 0> cs{arr};
        EXPECT_EQ (cs.size () == 0 && cs.data (), arr.data ());
    }
    { span<int, 5> s{arr}; }
    {
        auto get_an_array = [] () -> std::array<int, 4> { return {1, 2, 3, 4}; };
        auto take_a_span = [] (span<int> s) { static_cast<void> (s); };
        // try to take a temporary std::array
        take_a_span (get_an_array ());
    }
#endif

    {
        auto get_an_array = [] () -> std::array<int, 4> { return {{1, 2, 3, 4}}; };
        auto take_a_span = [] (span<int const> s) { static_cast<void> (s); };
        // try to take a temporary std::array
        take_a_span (span<int const, 4>{get_an_array ()});
    }
    {
        auto s = make_span (arr);
        EXPECT_EQ (s.size (), static_cast<std::ptrdiff_t> (arr.size ()));
        EXPECT_EQ (s.data (), arr.data ());
    }
}